

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

void icu_63::initShortZoneIdTrie(UErrorCode *status)

{
  int iVar1;
  StringEnumeration *pSVar2;
  TextTrieMap *this;
  undefined4 extraout_var;
  UChar *value;
  UChar *key;
  size_t size;
  UnicodeString *tzid;
  
  ucln_i18n_registerCleanup_63(UCLN_I18N_TIMEZONEFORMAT,tzfmt_cleanup);
  size = 0;
  pSVar2 = TimeZone::createTimeZoneIDEnumeration
                     (UCAL_ZONE_TYPE_CANONICAL,(char *)0x0,(int32_t *)0x0,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    this = (TextTrieMap *)UMemory::operator_new((UMemory *)0x38,size);
    if (this != (TextTrieMap *)0x0) {
      TextTrieMap::TextTrieMap(this,'\x01',(UObjectDeleter *)0x0);
      gShortZoneIdTrie = this;
      while( true ) {
        iVar1 = (*(pSVar2->super_UObject)._vptr_UObject[7])(pSVar2,status);
        tzid = (UnicodeString *)CONCAT44(extraout_var,iVar1);
        if (tzid == (UnicodeString *)0x0) break;
        value = ZoneMeta::findTimeZoneID(tzid);
        key = ZoneMeta::getShortID(tzid);
        if (value != (UChar *)0x0 && key != (UChar *)0x0) {
          TextTrieMap::put(gShortZoneIdTrie,key,value,status);
        }
      }
      goto LAB_001fee3c;
    }
    gShortZoneIdTrie = (TextTrieMap *)0x0;
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  if (pSVar2 == (StringEnumeration *)0x0) {
    return;
  }
LAB_001fee3c:
  (*(pSVar2->super_UObject)._vptr_UObject[1])(pSVar2);
  return;
}

Assistant:

static void U_CALLCONV initShortZoneIdTrie(UErrorCode &status) {
    U_ASSERT(gShortZoneIdTrie == NULL);
    ucln_i18n_registerCleanup(UCLN_I18N_TIMEZONEFORMAT, tzfmt_cleanup);
    StringEnumeration *tzenum = TimeZone::createTimeZoneIDEnumeration(UCAL_ZONE_TYPE_CANONICAL, NULL, NULL, status);
    if (U_SUCCESS(status)) {
        gShortZoneIdTrie = new TextTrieMap(TRUE, NULL);    // No deleter, because values are pooled by ZoneMeta
        if (gShortZoneIdTrie == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
        } else {
            const UnicodeString *id;
            while ((id = tzenum->snext(status)) != NULL) {
                const UChar* uID = ZoneMeta::findTimeZoneID(*id);
                const UChar* shortID = ZoneMeta::getShortID(*id);
                if (shortID && uID) {
                    gShortZoneIdTrie->put(shortID, const_cast<UChar *>(uID), status);
                }
            }
        }
    }
    delete tzenum;
}